

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_writer.c
# Opt level: O0

void write_primitive_quniform(aom_writer *w,uint16_t n,uint16_t v)

{
  int iVar1;
  int data;
  ushort in_DX;
  ushort in_SI;
  int m;
  int l;
  int in_stack_ffffffffffffffe8;
  
  if (1 < in_SI) {
    iVar1 = get_msb((uint)in_SI);
    iVar1 = iVar1 + 1;
    data = (1 << ((byte)iVar1 & 0x1f)) - (uint)in_SI;
    if ((int)(uint)in_DX < data) {
      aom_write_literal((aom_writer *)CONCAT26(in_SI,CONCAT24(in_DX,iVar1)),data,
                        in_stack_ffffffffffffffe8);
    }
    else {
      aom_write_literal((aom_writer *)CONCAT26(in_SI,CONCAT24(in_DX,iVar1)),data,
                        in_stack_ffffffffffffffe8);
      aom_write_bit((aom_writer *)CONCAT26(in_SI,CONCAT24(in_DX,iVar1)),data);
    }
  }
  return;
}

Assistant:

static void write_primitive_quniform(aom_writer *w, uint16_t n, uint16_t v) {
  if (n <= 1) return;
  const int l = get_msb(n) + 1;
  const int m = (1 << l) - n;
  if (v < m) {
    aom_write_literal(w, v, l - 1);
  } else {
    aom_write_literal(w, m + ((v - m) >> 1), l - 1);
    aom_write_bit(w, (v - m) & 1);
  }
}